

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O3

void deqp::gls::ShaderExecUtil::checkTessSupport
               (RenderContext *renderCtx,ShaderSpec *shaderSpec,ShaderType stage)

{
  bool bVar1;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int required;
  deUint32 pname;
  string local_40;
  
  bVar1 = glu::glslVersionIsES(shaderSpec->version);
  required = extraout_EDX;
  if ((bVar1) && ((int)shaderSpec->version < 3)) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"GL_EXT_tessellation_shader","");
    checkExtension(renderCtx,&local_40);
    required = extraout_EDX_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      required = extraout_EDX_01;
    }
  }
  if (stage == SHADERTYPE_TESSELLATION_CONTROL) {
    pname = 0x90d8;
  }
  else {
    if (stage != SHADERTYPE_TESSELLATION_EVALUATION) {
      return;
    }
    pname = 0x90d9;
  }
  checkLimit(renderCtx,pname,required);
  return;
}

Assistant:

void checkTessSupport (const glu::RenderContext& renderCtx, const ShaderSpec& shaderSpec, glu::ShaderType stage)
{
	const int numBlockRequired = 2; // highest binding is always 1 (output) i.e. count == 2

	if (glu::glslVersionIsES(shaderSpec.version) && shaderSpec.version <= glu::GLSL_VERSION_310_ES)
		checkExtension(renderCtx, "GL_EXT_tessellation_shader");

	if (stage == glu::SHADERTYPE_TESSELLATION_CONTROL)
		checkLimit(renderCtx, GL_MAX_TESS_CONTROL_SHADER_STORAGE_BLOCKS, numBlockRequired);
	else if (stage == glu::SHADERTYPE_TESSELLATION_EVALUATION)
		checkLimit(renderCtx, GL_MAX_TESS_EVALUATION_SHADER_STORAGE_BLOCKS, numBlockRequired);
	else
		DE_ASSERT(false);
}